

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::InsertAfterChild
          (TiXmlNode *this,TiXmlNode *afterThis,TiXmlNode *addThis)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TiXmlNode **ppTVar3;
  undefined4 extraout_var_03;
  TiXmlNode *node;
  TiXmlNode *pTVar2;
  
  if ((afterThis != (TiXmlNode *)0x0) && (afterThis->parent == this)) {
    pTVar2 = this;
    if (addThis->type == DOCUMENT) {
      while (iVar1 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar2),
            CONCAT44(extraout_var_00,iVar1) == 0) {
        ppTVar3 = &pTVar2->parent;
        pTVar2 = *ppTVar3;
        if (*ppTVar3 == (TiXmlNode *)0x0) {
          return (TiXmlNode *)0x0;
        }
      }
      iVar1 = (*(pTVar2->super_TiXmlBase)._vptr_TiXmlBase[4])(pTVar2);
      if (CONCAT44(extraout_var_01,iVar1) != 0) {
        while (iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this),
              CONCAT44(extraout_var_02,iVar1) == 0) {
          this = this->parent;
        }
        iVar1 = (*(this->super_TiXmlBase)._vptr_TiXmlBase[4])(this);
        TiXmlDocument::SetError
                  ((TiXmlDocument *)CONCAT44(extraout_var_03,iVar1),0x10,(char *)0x0,
                   (TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
        return (TiXmlNode *)0x0;
      }
    }
    else {
      iVar1 = (*(addThis->super_TiXmlBase)._vptr_TiXmlBase[0x10])(addThis);
      pTVar2 = (TiXmlNode *)CONCAT44(extraout_var,iVar1);
      if (pTVar2 != (TiXmlNode *)0x0) {
        pTVar2->parent = this;
        pTVar2->prev = afterThis;
        pTVar2->next = afterThis->next;
        if (afterThis->next == (TiXmlNode *)0x0) {
          if (this->lastChild != afterThis) {
            __assert_fail("lastChild == afterThis",
                          "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                          ,0xf8,
                          "TiXmlNode *despot::util::tinyxml::TiXmlNode::InsertAfterChild(TiXmlNode *, const TiXmlNode &)"
                         );
          }
          ppTVar3 = &this->lastChild;
        }
        else {
          ppTVar3 = &afterThis->next->prev;
        }
        *ppTVar3 = pTVar2;
        afterThis->next = pTVar2;
        return pTVar2;
      }
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::InsertAfterChild(TiXmlNode* afterThis,
	const TiXmlNode& addThis) {
	if (!afterThis || afterThis->parent != this) {
		return 0;
	}
	if (addThis.Type() == TiXmlNode::DOCUMENT) {
		if (GetDocument())
			GetDocument()->SetError(TIXML_ERROR_DOCUMENT_TOP_ONLY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
		return 0;
	}

	TiXmlNode* node = addThis.Clone();
	if (!node)
		return 0;
	node->parent = this;

	node->prev = afterThis;
	node->next = afterThis->next;
	if (afterThis->next) {
		afterThis->next->prev = node;
	} else {
		assert(lastChild == afterThis);
		lastChild = node;
	}
	afterThis->next = node;
	return node;
}